

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ModuleHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModuleHeaderSyntax,slang::syntax::ModuleHeaderSyntax_const&>
          (BumpAllocator *this,ModuleHeaderSyntax *args)

{
  ModuleHeaderSyntax *pMVar1;
  ModuleHeaderSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pMVar1 = (ModuleHeaderSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ModuleHeaderSyntax::ModuleHeaderSyntax(in_RSI,pMVar1);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }